

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::EmitOpcode(Parser *this,Opcode opcode)

{
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  value_type local_20;
  uint32_t local_18;
  Opcode local_14;
  uint32_t pos;
  Opcode opcode_local;
  Parser *this_local;
  
  local_14 = opcode;
  _pos = this;
  bVar1 = EnableDebugInfo();
  if ((bVar1) &&
     ((bVar1 = std::
               vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
               ::empty(&this->m_debugLines), bVar1 ||
      (pvVar2 = std::
                vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                ::back(&this->m_debugLines), pvVar2->lineNumber != this->m_lastLine)))) {
    sVar3 = BinaryWriter::Tell(&this->m_writer);
    local_20.opcodePosition = (uint32_t)sVar3;
    local_20.lineNumber = this->m_lastLine;
    local_18 = local_20.opcodePosition;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::push_back(&this->m_debugLines,&local_20);
  }
  BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,local_14);
  return;
}

Assistant:

inline_t void Parser::EmitOpcode(Opcode opcode)
	{
		// Only bother with writing this information if we're generating debug info
		if (EnableDebugInfo())
		{
			// Only write a new entry when we're at a new line, since that's all we're tracking
			if (m_debugLines.empty() || m_debugLines.back().lineNumber != m_lastLine)
			{
				auto pos = static_cast<uint32_t>(m_writer.Tell());
				m_debugLines.push_back({ pos, m_lastLine });
			}
		}
		m_writer.Write<Opcode, uint8_t>(opcode);
	}